

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O0

void __thiscall ObjectFile::refresh(ObjectFile *this,bool isFirstTime)

{
  bool bVar1;
  undefined8 uVar2;
  mapped_type *ppOVar3;
  mapped_type pOVar4;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  value_4;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> value_3;
  ByteString value_2;
  unsigned_long value_1;
  bool value;
  unsigned_long osAttrType;
  unsigned_long p11AttrType;
  unsigned_long curGen;
  MutexLocker lock;
  File objectFile;
  undefined8 in_stack_fffffffffffffda8;
  undefined4 uVar5;
  Mutex *inMutex;
  OSAttribute *in_stack_fffffffffffffdb0;
  mapped_type in_stack_fffffffffffffdb8;
  File *in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined1 block;
  File *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  File *in_stack_fffffffffffffde8;
  mapped_type in_stack_fffffffffffffdf0;
  mapped_type *in_stack_fffffffffffffe00;
  File *in_stack_fffffffffffffe08;
  ObjectFile *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe30;
  File *in_stack_fffffffffffffe38;
  File *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  File local_138 [2];
  long local_a0;
  unsigned_long local_90;
  int local_78;
  string local_68 [32];
  File local_48;
  byte local_9;
  
  block = (undefined1)((ulong)in_stack_fffffffffffffdd0 >> 0x38);
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  local_9 = in_SIL & 1;
  if ((*(byte *)(in_RDI + 0x80) & 1) != 0) {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x121,"The object is in a transaction");
    return;
  }
  if ((local_9 == 0) && (*(long *)(in_RDI + 0x70) != 0)) {
    OSToken::index(*(OSToken **)(in_RDI + 0x70),(char *)0x0,in_EDX);
  }
  if (((local_9 & 1) == 0) &&
     ((*(long *)(in_RDI + 0x30) == 0 ||
      (bVar1 = Generation::wasUpdated
                         ((Generation *)
                          CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)), !bVar1))))
  {
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x130,"The object generation has not been updated");
    return;
  }
  std::__cxx11::string::string(local_68,(string *)(in_RDI + 8));
  inMutex = (Mutex *)CONCAT44(uVar5,1);
  File::File(in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38,
             (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe30 >> 0x18,0),
             SUB81((ulong)in_stack_fffffffffffffe30 >> 0x10,0),
             SUB81((ulong)in_stack_fffffffffffffe30 >> 8,0),SUB81(in_stack_fffffffffffffe30,0));
  std::__cxx11::string::~string(local_68);
  bVar1 = File::isValid(&local_48);
  if (!bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x139,"Object %s is invalid",uVar2);
    *(undefined1 *)(in_RDI + 0x68) = 0;
    local_78 = 1;
    goto LAB_001d5190;
  }
  File::lock(in_stack_fffffffffffffdd8,(bool)block);
  bVar1 = File::isEmpty(in_stack_fffffffffffffe38);
  if (bVar1) {
    uVar2 = std::__cxx11::string::c_str();
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x144,"Object %s is empty",uVar2);
    File::unlock(in_stack_fffffffffffffdc8);
    local_78 = 1;
    goto LAB_001d5190;
  }
  uVar2 = std::__cxx11::string::c_str();
  softHSMLog(7,"refresh",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
             ,0x14b,"Object %s has changed",uVar2);
  discardAttributes(in_stack_fffffffffffffe20);
  MutexLocker::MutexLocker((MutexLocker *)in_stack_fffffffffffffdb0,inMutex);
  bVar1 = File::readULong(in_stack_fffffffffffffe08,(unsigned_long *)in_stack_fffffffffffffe00);
  if (bVar1) {
    Generation::set(*(Generation **)(in_RDI + 0x30),local_90);
LAB_001d4645:
    do {
      bVar1 = File::isEOF((File *)in_stack_fffffffffffffdb0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001d515d:
        File::unlock(in_stack_fffffffffffffdc8);
        *(undefined1 *)(in_RDI + 0x68) = 1;
        local_78 = 0;
        break;
      }
      bVar1 = File::readULong(in_stack_fffffffffffffe08,(unsigned_long *)in_stack_fffffffffffffe00);
      if (!bVar1) {
        bVar1 = File::isEOF((File *)in_stack_fffffffffffffdb0);
        if (bVar1) goto LAB_001d515d;
        uVar2 = std::__cxx11::string::c_str();
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x174,"Corrupt object file %s",uVar2);
        *(undefined1 *)(in_RDI + 0x68) = 0;
        File::unlock(in_stack_fffffffffffffdc8);
        local_78 = 1;
        break;
      }
      bVar1 = File::readULong(in_stack_fffffffffffffe08,(unsigned_long *)in_stack_fffffffffffffe00);
      if (!bVar1) {
        uVar2 = std::__cxx11::string::c_str();
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x17f,"Corrupt object file %s",uVar2);
        *(undefined1 *)(in_RDI + 0x68) = 0;
        File::unlock(in_stack_fffffffffffffdc8);
        local_78 = 1;
        break;
      }
      if (local_a0 == 1) {
        bVar1 = File::readBool((File *)in_stack_fffffffffffffdb8,(bool *)in_stack_fffffffffffffdb0);
        if (!bVar1) {
          uVar2 = std::__cxx11::string::c_str();
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,399,"Corrupt object file %s",uVar2);
          *(undefined1 *)(in_RDI + 0x68) = 0;
          File::unlock(in_stack_fffffffffffffdc8);
          local_78 = 1;
          break;
        }
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        if (*ppOVar3 != (mapped_type)0x0) {
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                  *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8)
          ;
          if (*ppOVar3 != (mapped_type)0x0) {
            (*(*ppOVar3)->_vptr_OSAttribute[1])();
          }
        }
        pOVar4 = (mapped_type)operator_new(0xa0);
        OSAttribute::OSAttribute(in_stack_fffffffffffffdb0,SUB81((ulong)inMutex >> 0x38,0));
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        *ppOVar3 = pOVar4;
        goto LAB_001d4645;
      }
      if (local_a0 == 2) {
        bVar1 = File::readULong(in_stack_fffffffffffffe08,(unsigned_long *)in_stack_fffffffffffffe00
                               );
        if (!bVar1) {
          uVar2 = std::__cxx11::string::c_str();
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1a5,"Corrupt object file %s",uVar2);
          *(undefined1 *)(in_RDI + 0x68) = 0;
          File::unlock(in_stack_fffffffffffffdc8);
          local_78 = 1;
          break;
        }
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        if (*ppOVar3 != (mapped_type)0x0) {
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                  *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8)
          ;
          if (*ppOVar3 != (mapped_type)0x0) {
            (*(*ppOVar3)->_vptr_OSAttribute[1])();
          }
        }
        pOVar4 = (mapped_type)operator_new(0xa0);
        OSAttribute::OSAttribute(in_stack_fffffffffffffdb0,(unsigned_long)inMutex);
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        *ppOVar3 = pOVar4;
        goto LAB_001d4645;
      }
      if (local_a0 == 3) {
        ByteString::ByteString((ByteString *)0x1d4b30);
        bVar1 = File::readByteString
                          ((File *)in_stack_fffffffffffffdb8,(ByteString *)in_stack_fffffffffffffdb0
                          );
        if (bVar1) {
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                  *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8)
          ;
          if (*ppOVar3 != (mapped_type)0x0) {
            ppOVar3 = std::
                      map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                      ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                    *)in_stack_fffffffffffffdf0,
                                   (key_type *)in_stack_fffffffffffffde8);
            if (*ppOVar3 != (mapped_type)0x0) {
              (*(*ppOVar3)->_vptr_OSAttribute[1])();
            }
          }
          pOVar4 = (mapped_type)operator_new(0xa0);
          OSAttribute::OSAttribute
                    ((OSAttribute *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                     (ByteString *)in_stack_fffffffffffffdd8);
          ppOVar3 = std::
                    map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                    ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                  *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8)
          ;
          *ppOVar3 = pOVar4;
          local_78 = 0;
        }
        else {
          uVar2 = std::__cxx11::string::c_str();
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1bb,"Corrupt object file %s",uVar2);
          *(undefined1 *)(in_RDI + 0x68) = 0;
          File::unlock(in_stack_fffffffffffffdc8);
          local_78 = 1;
        }
        ByteString::~ByteString((ByteString *)0x1d4cd1);
joined_r0x001d4ebf:
        if (local_78 != 0) break;
        goto LAB_001d4645;
      }
      if (local_a0 == 5) {
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x1d4d3b);
        bVar1 = File::readMechanismTypeSet
                          (in_stack_fffffffffffffde8,
                           (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
        if (bVar1) {
          in_stack_fffffffffffffe08 =
               (File *)std::
                       map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                       ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                     *)in_stack_fffffffffffffdf0,
                                    (key_type *)in_stack_fffffffffffffde8);
          if ((mapped_type)in_stack_fffffffffffffe08->_vptr_File != (mapped_type)0x0) {
            in_stack_fffffffffffffe00 =
                 std::
                 map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                 ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                               *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
            if (*in_stack_fffffffffffffe00 != (mapped_type)0x0) {
              (*(*in_stack_fffffffffffffe00)->_vptr_OSAttribute[1])();
            }
          }
          in_stack_fffffffffffffdf0 = (mapped_type)operator_new(0xa0);
          OSAttribute::OSAttribute
                    ((OSAttribute *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                     (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )in_stack_fffffffffffffdd8);
          in_stack_fffffffffffffde8 =
               (File *)std::
                       map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                       ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                     *)in_stack_fffffffffffffdf0,
                                    (key_type *)in_stack_fffffffffffffde8);
          in_stack_fffffffffffffde8->_vptr_File = (_func_int **)in_stack_fffffffffffffdf0;
          local_78 = 0;
        }
        else {
          uVar2 = std::__cxx11::string::c_str();
          softHSMLog(7,"refresh",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                     ,0x1d1,"Corrupt object file %s",uVar2);
          *(undefined1 *)(in_RDI + 0x68) = 0;
          File::unlock(in_stack_fffffffffffffdc8);
          local_78 = 1;
        }
        std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                  ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                   0x1d4eb6);
        goto joined_r0x001d4ebf;
      }
      if (local_a0 != 4) {
        uVar2 = std::__cxx11::string::c_str();
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x1f9,"Corrupt object file %s with unknown attribute of type %d",uVar2,local_a0)
        ;
        *(undefined1 *)(in_RDI + 0x68) = 0;
        File::unlock(in_stack_fffffffffffffdc8);
        local_78 = 1;
        break;
      }
      in_stack_fffffffffffffdd8 = local_138;
      std::
      map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
      ::map((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
             *)0x1d4f1d);
      in_stack_fffffffffffffde7 =
           File::readAttributeMap
                     ((File *)lock.mutex,
                      (map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                       *)lock._vptr_MutexLocker);
      if ((bool)in_stack_fffffffffffffde7) {
        ppOVar3 = std::
                  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                  ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        if (*ppOVar3 != (mapped_type)0x0) {
          in_stack_fffffffffffffdc8 =
               (File *)std::
                       map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                       ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                                     *)in_stack_fffffffffffffdf0,
                                    (key_type *)in_stack_fffffffffffffde8);
          if ((mapped_type)in_stack_fffffffffffffdc8->_vptr_File != (mapped_type)0x0) {
            (*((mapped_type)in_stack_fffffffffffffdc8->_vptr_File)->_vptr_OSAttribute[1])();
          }
        }
        in_stack_fffffffffffffdb8 = (mapped_type)operator_new(0xa0);
        OSAttribute::OSAttribute
                  ((OSAttribute *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                   (map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                    *)in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffdb0 =
             (OSAttribute *)
             std::
             map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
             ::operator[]((map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                           *)in_stack_fffffffffffffdf0,(key_type *)in_stack_fffffffffffffde8);
        in_stack_fffffffffffffdb0->_vptr_OSAttribute = (_func_int **)in_stack_fffffffffffffdb8;
        local_78 = 0;
      }
      else {
        uVar2 = std::__cxx11::string::c_str();
        softHSMLog(7,"refresh",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                   ,0x1e7,"Corrupt object file %s",uVar2);
        *(undefined1 *)(in_RDI + 0x68) = 0;
        File::unlock(in_stack_fffffffffffffdc8);
        local_78 = 1;
      }
      std::
      map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
      ::~map((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
              *)0x1d5098);
    } while (local_78 == 0);
  }
  else {
    bVar1 = File::isEOF((File *)in_stack_fffffffffffffdb0);
    if (bVar1) goto LAB_001d4645;
    uVar2 = std::__cxx11::string::c_str();
    softHSMLog(7,"refresh",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0x159,"Corrupt object file %s",uVar2);
    *(undefined1 *)(in_RDI + 0x68) = 0;
    File::unlock(in_stack_fffffffffffffdc8);
    local_78 = 1;
  }
  MutexLocker::~MutexLocker((MutexLocker *)in_stack_fffffffffffffdb0);
LAB_001d5190:
  File::~File((File *)in_stack_fffffffffffffdb0);
  return;
}

Assistant:

void ObjectFile::refresh(bool isFirstTime /* = false */)
{
	// Check if we're in the middle of a transaction
	if (inTransaction)
	{
		DEBUG_MSG("The object is in a transaction");

		return;
	}

	// Refresh the associated token if set
	if (!isFirstTime && (token != NULL))
	{
		// This may cause this instance to become invalid
		token->index();
	}

	// Check the generation
	if (!isFirstTime && (gen == NULL || !gen->wasUpdated()))
	{
		DEBUG_MSG("The object generation has not been updated");

		return;
	}

	File objectFile(path, umask);

	if (!objectFile.isValid())
	{
		DEBUG_MSG("Object %s is invalid", path.c_str());

		valid = false;

		return;
	}

	objectFile.lock();

	if (objectFile.isEmpty())
	{
		DEBUG_MSG("Object %s is empty", path.c_str());
		
		objectFile.unlock();

		return;
	}

	DEBUG_MSG("Object %s has changed", path.c_str());

	// Discard the existing set of attributes
	discardAttributes();

	MutexLocker lock(objectMutex);

	// Read back the generation number
	unsigned long curGen;

	if (!objectFile.readULong(curGen))
	{
		if (!objectFile.isEOF())
		{
			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}
	}
	else
	{
		gen->set(curGen);
	}

	// Read back the attributes
	while (!objectFile.isEOF())
	{
		unsigned long p11AttrType;
		unsigned long osAttrType;

		if (!objectFile.readULong(p11AttrType))
		{
			if (objectFile.isEOF())
			{
				break;
			}

			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}

		if (!objectFile.readULong(osAttrType))
		{
			DEBUG_MSG("Corrupt object file %s", path.c_str());

			valid = false;

			objectFile.unlock();

			return;
		}

		// Depending on the type, read back the actual value
		if (osAttrType == BOOLEAN_ATTR)
		{
			bool value;

			if (!objectFile.readBool(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == ULONG_ATTR)
		{
			unsigned long value;

			if (!objectFile.readULong(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == BYTESTR_ATTR)
		{
			ByteString value;

			if (!objectFile.readByteString(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == MECHSET_ATTR)
		{
			std::set<CK_MECHANISM_TYPE> value;

			if (!objectFile.readMechanismTypeSet(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else if (osAttrType == ATTRMAP_ATTR)
		{
			std::map<CK_ATTRIBUTE_TYPE,OSAttribute> value;

			if (!objectFile.readAttributeMap(value))
			{
				DEBUG_MSG("Corrupt object file %s", path.c_str());

				valid = false;

				objectFile.unlock();

				return;
			}

			if (attributes[p11AttrType] != NULL)
			{
				delete attributes[p11AttrType];
			}

			attributes[p11AttrType] = new OSAttribute(value);
		}
		else
		{
			DEBUG_MSG("Corrupt object file %s with unknown attribute of type %d", path.c_str(), osAttrType);

			valid = false;

			objectFile.unlock();

			return;
		}
	}

	objectFile.unlock();

	valid = true;
}